

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu1_ret_task(void *hal,HalEncTask *task)

{
  HalJpegeCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  *(RK_S32 *)((long)hal + 0x148) = (task->rc_task->info).quality_target;
  (task->rc_task->info).bit_real = *(int *)((long)hal + 0xfc) << 3;
  (task->hal_ret).data = (void *)((long)hal + 0xf8);
  (task->hal_ret).number = 1;
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vepu1_ret_task(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    ctx->hal_rc.last_quality = task->rc_task->info.quality_target;
    task->rc_task->info.bit_real = ctx->feedback.stream_length * 8;
    task->hal_ret.data = &ctx->feedback;
    task->hal_ret.number = 1;

    return MPP_OK;
}